

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

UniValue * __thiscall UniValue::operator[](UniValue *this,string *key)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  size_t index;
  size_t local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->typ == VOBJ) {
    local_18 = 0;
    bVar1 = findKey(this,key,&local_18);
    if (bVar1) {
      pUVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&this->values,local_18);
      goto LAB_00afec74;
    }
  }
  pUVar2 = &NullUniValue;
LAB_00afec74:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pUVar2;
  }
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::operator[](const std::string& key) const
{
    if (typ != VOBJ)
        return NullUniValue;

    size_t index = 0;
    if (!findKey(key, index))
        return NullUniValue;

    return values.at(index);
}